

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::get_ready_timers(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                   *this,op_queue<asio::detail::scheduler_operation> *ops)

{
  bool bVar1;
  reference pvVar2;
  per_timer_data *in_RDI;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *unaff_retaddr;
  per_timer_data *timer;
  time_type now;
  time_type *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  byte bVar3;
  per_timer_data *in_stack_ffffffffffffffe0;
  per_timer_data *timer_00;
  
  timer_00 = in_RDI;
  bVar1 = std::
          vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
          ::empty((vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                   *)in_stack_ffffffffffffffe0);
  if (!bVar1) {
    chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
    ::now();
    while( true ) {
      bVar1 = std::
              vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
              ::empty((vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                       *)in_stack_ffffffffffffffe0);
      bVar3 = 0;
      if (!bVar1) {
        std::
        vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
        ::operator[]((vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                      *)&in_RDI->next_,0);
        bVar1 = chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
                ::less_than((time_type *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8);
        bVar3 = bVar1 ^ 0xff;
      }
      if ((bVar3 & 1) == 0) break;
      pvVar2 = std::
               vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
               ::operator[]((vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                             *)&in_RDI->next_,0);
      in_stack_ffffffffffffffe0 = pvVar2->timer_;
      op_queue<asio::detail::scheduler_operation>::push<asio::detail::wait_op>
                ((op_queue<asio::detail::scheduler_operation> *)in_stack_ffffffffffffffe0,
                 &in_RDI->op_queue_);
      remove_timer(unaff_retaddr,timer_00);
    }
  }
  return;
}

Assistant:

virtual void get_ready_timers(op_queue<operation>& ops)
  {
    if (!heap_.empty())
    {
      const time_type now = Time_Traits::now();
      while (!heap_.empty() && !Time_Traits::less_than(now, heap_[0].time_))
      {
        per_timer_data* timer = heap_[0].timer_;
        ops.push(timer->op_queue_);
        remove_timer(*timer);
      }
    }
  }